

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

RPCHelpMan * mockscheduler(void)

{
  string name;
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_01;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  _Manager_type in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffc48;
  pointer in_stack_fffffffffffffc58;
  pointer pRVar1;
  pointer in_stack_fffffffffffffc60;
  pointer pRVar2;
  pointer in_stack_fffffffffffffc68;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc88 [16];
  pointer in_stack_fffffffffffffc98;
  pointer in_stack_fffffffffffffca0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcc9;
  undefined8 in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffce0;
  undefined8 in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  string local_2e8 [32];
  RPCResult local_2c8;
  RPCArgOptions local_240;
  string local_1f8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1d8;
  undefined1 local_180;
  string local_178 [32];
  RPCArg local_158;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"mockscheduler",(allocator<char> *)&stack0xfffffffffffffcb7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"\nBump the scheduler into the future (-regtest only)\n",
             (allocator<char> *)&stack0xfffffffffffffcb6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"delta_time",(allocator<char> *)&stack0xfffffffffffffc97);
  local_1d8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_180 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"Number of seconds to forward the scheduler into the future.",
             (allocator<char> *)&stack0xfffffffffffffc96);
  local_240.oneline_description._M_dataplus._M_p = (pointer)&local_240.oneline_description.field_2;
  local_240.skip_type_check = false;
  local_240.oneline_description._M_string_length = 0;
  local_240.oneline_description.field_2._M_local_buf[0] = '\0';
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_240._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffffc20;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc18;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffffc28;
  name.field_2._8_8_ = in_stack_fffffffffffffc30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffffc40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffffc38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffffc48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffffc58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffffc60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffffc68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffffc70._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffffc70._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffffc70._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffffc88;
  description_01._M_string_length = (size_type)in_stack_fffffffffffffca0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc98;
  description_01.field_2 = in_stack_fffffffffffffca8;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcc0;
  opts._0_8_ = in_stack_fffffffffffffcb8;
  opts.oneline_description._M_string_length._0_1_ = in_stack_fffffffffffffcc8;
  opts.oneline_description._M_string_length._1_7_ = in_stack_fffffffffffffcc9;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffffcd0;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffffcd8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffce0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffce8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffcf0;
  opts.hidden = (bool)(char)in_stack_fffffffffffffcf8;
  opts.also_positional = (bool)(char)((ulong)in_stack_fffffffffffffcf8 >> 8);
  opts._66_6_ = (int6)((ulong)in_stack_fffffffffffffcf8 >> 0x10);
  RPCArg::RPCArg(&local_158,name,(Type)local_178,fallback,description_01,opts);
  __l._M_len = 1;
  __l._M_array = &local_158;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffc98,__l,
             (allocator_type *)&stack0xfffffffffffffc95);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"",(allocator<char> *)&stack0xfffffffffffffc77);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffcf8,"",(allocator<char> *)&stack0xfffffffffffffc76);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffc20;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc18;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffc28;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffc30;
  description._M_string_length = in_stack_fffffffffffffc40;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc38;
  description.field_2 = in_stack_fffffffffffffc48;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_2c8,NONE,m_key_name,description,inner,SUB81(local_2e8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc20;
  result._0_8_ = in_stack_fffffffffffffc18;
  result.m_key_name._M_string_length = in_stack_fffffffffffffc28;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffc30;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffc38;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc40;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffc48;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffc70;
  result.m_cond._8_16_ = in_stack_fffffffffffffc88;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffc98;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffc78,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffcb8,"",(allocator<char> *)&stack0xfffffffffffffc57);
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/node.cpp:85:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/node.cpp:85:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffc48;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc98;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc88._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffc88._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffca0;
  fun.super__Function_base._M_manager = (_Manager_type)&stack0xfffffffffffffcc8;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffffca8._M_local_buf;
  fun._M_invoker = (_Invoker_type)0x0;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffc20,&stack0xfffffffffffffc28)),
             description_00,args,(RPCResults)in_stack_fffffffffffffc70,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffc28);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcd8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffc78);
  RPCResult::~RPCResult(&local_2c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffc58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcf8);
  std::__cxx11::string::~string(local_2e8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffc98);
  RPCArg::~RPCArg(&local_158);
  RPCArgOptions::~RPCArgOptions(&local_240);
  std::__cxx11::string::~string(local_1f8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1d8._M_first);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan mockscheduler()
{
    return RPCHelpMan{"mockscheduler",
        "\nBump the scheduler into the future (-regtest only)\n",
        {
            {"delta_time", RPCArg::Type::NUM, RPCArg::Optional::NO, "Number of seconds to forward the scheduler into the future." },
        },
        RPCResult{RPCResult::Type::NONE, "", ""},
        RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    if (!Params().IsMockableChain()) {
        throw std::runtime_error("mockscheduler is for regression testing (-regtest mode) only");
    }

    int64_t delta_seconds = request.params[0].getInt<int64_t>();
    if (delta_seconds <= 0 || delta_seconds > 3600) {
        throw std::runtime_error("delta_time must be between 1 and 3600 seconds (1 hr)");
    }

    const NodeContext& node_context{EnsureAnyNodeContext(request.context)};
    CHECK_NONFATAL(node_context.scheduler)->MockForward(std::chrono::seconds{delta_seconds});
    CHECK_NONFATAL(node_context.validation_signals)->SyncWithValidationInterfaceQueue();
    for (const auto& chain_client : node_context.chain_clients) {
        chain_client->schedulerMockForward(std::chrono::seconds(delta_seconds));
    }

    return UniValue::VNULL;
},
    };
}